

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

Ivy_Store_t * Ivy_NodeFindCutsAll(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  ushort uVar1;
  int iVar2;
  short sVar3;
  uint uVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Ivy_Cut_t local_54;
  
  if (6 < nLeaves) {
    __assert_fail("nLeaves <= IVY_CUT_INPUT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,899,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  Ivy_NodeFindCutsAll::CutStore.nCuts = 0;
  Ivy_NodeFindCutsAll::CutStore.nCutsMax = 0x100;
  local_54.nSize = 1;
  local_54.nSizeMax = (short)nLeaves;
  local_54.pArray[0] = pObj->Id;
  iVar7 = 1;
  local_54.uHash = 1 << ((byte)(local_54.pArray[0] % 0x1f) & 0x1f);
  Ivy_NodeCutFindOrAdd(&Ivy_NodeFindCutsAll::CutStore,&local_54);
  if (Ivy_NodeFindCutsAll::CutStore.nCuts != 1) {
    __assert_fail("pCutStore->nCuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x390,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  lVar11 = 0xcd9298;
  for (lVar9 = 0; lVar9 < iVar7; lVar9 = lVar9 + 1) {
    sVar3 = Ivy_NodeFindCutsAll::CutStore.pCuts[lVar9].nSize;
    if (sVar3 != 0) {
      for (lVar12 = 0; lVar12 < sVar3; lVar12 = lVar12 + 1) {
        pIVar5 = Ivy_ManObj(p,*(int *)(lVar9 * 0x24 + 0xcd9298 + lVar12 * 4));
        uVar4 = *(uint *)&pIVar5->field_0x8 & 0xf;
        if ((uVar4 != 1) && (uVar4 != 4)) {
          pIVar6 = Ivy_ObjRealFanin((Ivy_Obj_t *)((ulong)pIVar5->pFanin0 & 0xfffffffffffffffe));
          iVar7 = pIVar6->Id;
          pIVar5 = Ivy_ObjRealFanin((Ivy_Obj_t *)((ulong)pIVar5->pFanin1 & 0xfffffffffffffffe));
          iVar2 = pIVar5->Id;
          uVar1 = Ivy_NodeFindCutsAll::CutStore.pCuts[lVar9].nSize;
          if (Ivy_NodeFindCutsAll::CutStore.pCuts[lVar9].nSizeMax <= (short)uVar1) {
            uVar4 = 0;
            if (0 < (short)uVar1) {
              uVar4 = (uint)uVar1;
            }
            uVar8 = 0;
            do {
              if (uVar4 == uVar8) goto LAB_0073986c;
              iVar10 = *(int *)(lVar11 + uVar8 * 4);
            } while ((iVar10 != iVar7) && (uVar8 = uVar8 + 1, iVar10 != iVar2));
          }
          iVar10 = iVar2;
          if (iVar2 < iVar7) {
            iVar10 = iVar7;
            iVar7 = iVar2;
          }
          Ivy_NodeCutDeriveNew
                    (Ivy_NodeFindCutsAll::CutStore.pCuts + lVar9,&local_54,
                     *(int *)(lVar9 * 0x24 + 0xcd9298 + lVar12 * 4),iVar7,iVar10);
          Ivy_NodeCutFindOrAddFilter(&Ivy_NodeFindCutsAll::CutStore,&local_54);
          if (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100) goto LAB_00739899;
        }
LAB_0073986c:
        sVar3 = Ivy_NodeFindCutsAll::CutStore.pCuts[lVar9].nSize;
      }
      iVar7 = Ivy_NodeFindCutsAll::CutStore.nCuts;
      if (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100) break;
    }
    lVar11 = lVar11 + 0x24;
  }
LAB_00739899:
  Ivy_NodeCompactCuts(&Ivy_NodeFindCutsAll::CutStore);
  return &Ivy_NodeFindCutsAll::CutStore;
}

Assistant:

Ivy_Store_t * Ivy_NodeFindCutsAll( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = pObj->Id;
    Ivy_NodeCutHash( pCutNew );
    // add the trivial cut
    Ivy_NodeCutFindOrAdd( pCutStore, pCutNew );
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, pCut->pArray[k] );
            if ( Ivy_ObjIsCi(pLeaf) )
                continue;
/*
            *pCutNew = *pCut;
            Ivy_NodeCutShrink( pCutNew, pLeaf->Id );
            if ( !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId0(pLeaf) ) )
                continue;
            if ( Ivy_ObjIsNode(pLeaf) && !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId1(pLeaf) ) )
                continue;
            Ivy_NodeCutHash( pCutNew );
*/
            iLeaf0 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin0(pLeaf)) );
            iLeaf1 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin1(pLeaf)) );
//            if ( iLeaf0 == iLeaf1 ) // strange situation observed on Jan 18, 2007
//                continue;
            if ( !Ivy_NodeCutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            if ( iLeaf0 > iLeaf1 )
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf1, iLeaf0 );
            else
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 );
            Ivy_NodeCutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    Ivy_NodeCompactCuts( pCutStore );
//    Ivy_NodePrintCuts( pCutStore );
    return pCutStore;
}